

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_test_add.cpp
# Opt level: O2

void add_test(void)

{
  ostream *poVar1;
  
  test_base<unsigned_long,unsigned_int,bool(*)(unsigned_long,unsigned_int,unsigned_long*),unsigned_long(*)(unsigned_long,unsigned_int),3>
            ("uint64_uint32",check_add_uint64_uint32,safe_add_uint64_uint32);
  test_base<unsigned_long,int,bool(*)(unsigned_long,int,unsigned_long*),unsigned_long(*)(unsigned_long,int),3>
            ("uint64_int32",check_add_uint64_int32,safe_add_uint64_int32);
  test_base<long,unsigned_int,bool(*)(long,unsigned_int,long*),long(*)(long,unsigned_int),3>
            ("int64_uint32",check_add_int64_uint32,safe_add_int64_uint32);
  test_base<long,int,bool(*)(long,int,long*),long(*)(long,int),3>
            ("int64_int32",check_add_int64_int32,safe_add_int64_int32);
  test_base<unsigned_int,unsigned_int,bool(*)(unsigned_int,unsigned_int,unsigned_int*),unsigned_int(*)(unsigned_int,unsigned_int),3>
            ("uint32_uint32",check_add_uint32_uint32,safe_add_uint32_uint32);
  test_base<unsigned_int,int,bool(*)(unsigned_int,int,unsigned_int*),unsigned_int(*)(unsigned_int,int),3>
            ("uint32_int32",check_add_uint32_int32,safe_add_uint32_int32);
  test_base<int,unsigned_int,bool(*)(int,unsigned_int,int*),int(*)(int,unsigned_int),3>
            ("int32_uint32",check_add_int32_uint32,safe_add_int32_uint32);
  test_base<int,int,bool(*)(int,int,int*),int(*)(int,int),3>
            ("int32_int32",check_add_int32_int32,safe_add_int32_int32);
  poVar1 = std::operator<<((ostream *)&std::cout,"Addition tests completed");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void add_test()
{
	try
	{
		add_test_uint64_uint64();
		add_test_uint64_uint32();
		add_test_uint64_int64();
		add_test_uint64_int32();

		add_test_int64_uint64();
		add_test_int64_uint32();
		add_test_int64_int64();
		add_test_int64_int32();

		add_test_uint32_uint64();
		add_test_uint32_uint32();
		add_test_uint32_int64();
		add_test_uint32_int32();

		add_test_int32_uint64();
		add_test_int32_uint32();
		add_test_int32_int64();
		add_test_int32_int32();

		std::cout << "Addition tests completed" << std::endl;
	}
	catch (std::exception& err)
	{
		std::cout << "Addition tests failed - " << err.what() << std::endl;
	}

	return;
}